

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.cpp
# Opt level: O3

QDBusArgument * operator>>(QDBusArgument *a,QRectF *rect)

{
  long in_FS_OFFSET;
  double height;
  double width;
  double y;
  double x;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = -NAN;
  local_48 = -NAN;
  local_50 = -NAN;
  local_58 = -NAN;
  QDBusArgument::beginStructure(a);
  QDBusArgument::operator>>(a,&local_40);
  QDBusArgument::operator>>(a,&local_48);
  QDBusArgument::operator>>(a,&local_50);
  QDBusArgument::operator>>(a,&local_58);
  QDBusArgument::endStructure(a);
  rect->xp = local_40;
  rect->yp = local_48;
  rect->w = local_50;
  rect->h = local_58;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

const QDBusArgument &operator>>(const QDBusArgument &a, QRectF &rect)
{
    double x, y, width, height;
    a.beginStructure();
    a >> x >> y >> width >> height;
    a.endStructure();

    rect.setRect(qreal(x), qreal(y), qreal(width), qreal(height));
    return a;
}